

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_decoder.c
# Opt level: O0

int main(int argc,char **argv)

{
  aom_codec_err_t aVar1;
  int iVar2;
  FILE *__stream;
  aom_codec_iface_t *iface;
  char *pcVar3;
  FILE *file;
  FILE *pFVar4;
  aom_image_t *dst;
  undefined8 *in_RSI;
  int in_EDI;
  aom_image_t *img_shifted;
  aom_image_t *img;
  aom_codec_iter_t iter;
  size_t ret;
  aom_codec_ctx_t codec;
  aom_codec_iface_t *decoder;
  uint i;
  uint8_t tmpbuf [32];
  aom_codec_stream_info_t si;
  ObuDecInputContext obu_ctx;
  AvxInputContext aom_input_ctx;
  size_t buffer_size;
  size_t bytes_in_buffer;
  uint8_t *buf;
  FILE *inputfile;
  char filename [80];
  FILE *outfile [5];
  int frame_cnt;
  aom_image_t *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  uint8_t *in_stack_fffffffffffffd78;
  aom_image_t *iter_00;
  aom_codec_iface_t *in_stack_fffffffffffffd80;
  aom_codec_iface_t *in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint in_stack_fffffffffffffd98;
  aom_img_fmt_t in_stack_fffffffffffffd9c;
  aom_image_t *in_stack_fffffffffffffda0;
  uint local_22c;
  undefined1 local_228 [24];
  size_t *in_stack_fffffffffffffdf0;
  size_t *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar5;
  undefined8 *local_1f0 [4];
  char local_98 [80];
  FILE *local_48 [6];
  uint local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_1f0,0,0x28);
  local_1f0[0] = (undefined8 *)&stack0xfffffffffffffe38;
  exec_name = (char *)*local_10;
  if (local_8 != 2) {
    die("Invalid number of arguments.");
  }
  __stream = fopen64((char *)local_10[1],"rb");
  if (__stream == (FILE *)0x0) {
    die("Failed to open %s for read.",local_10[1]);
  }
  local_1f0[0][1] = __stream;
  *local_1f0[0] = local_10[1];
  iface = get_aom_decoder_by_index(0);
  pcVar3 = aom_codec_iface_name(iface);
  printf("Using %s\n",pcVar3);
  aVar1 = aom_codec_dec_init_ver
                    ((aom_codec_ctx_t *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88,(aom_codec_dec_cfg_t *)in_stack_fffffffffffffd80,
                     (aom_codec_flags_t)in_stack_fffffffffffffd78,
                     (int)(in_stack_fffffffffffffd70 >> 0x20));
  if (aVar1 != AOM_CODEC_OK) {
    die("Failed to initialize decoder.");
  }
  aVar1 = aom_codec_control((aom_codec_ctx_t *)&stack0xfffffffffffffd90,0x118,1);
  if (aVar1 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  }
  file = (FILE *)fread(local_228,1,0x20,__stream);
  if (file != (FILE *)0x20) {
    die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  }
  uVar5 = 0;
  aVar1 = aom_codec_peek_stream_info
                    (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                     (aom_codec_stream_info_t *)in_stack_fffffffffffffd68);
  if (aVar1 != AOM_CODEC_OK) {
    die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  }
  fseek(__stream,-0x20,1);
  iVar2 = file_is_obu((ObuDecInputContext *)CONCAT44(uVar5,in_stack_fffffffffffffe08));
  if (iVar2 == 0) {
    die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  }
  snprintf(local_98,0x50,"out_lyr%d.yuv",0);
  local_48[0] = fopen64(local_98,"wb");
  if (local_48[0] != (FILE *)0x0) {
    for (local_22c = 1; local_22c < in_stack_fffffffffffffe04; local_22c = local_22c + 1) {
      snprintf(local_98,0x50,"out_lyr%u.yuv",(ulong)local_22c);
      pFVar4 = fopen64(local_98,"wb");
      local_48[local_22c] = pFVar4;
      if (pFVar4 == (FILE *)0x0) {
        die("Failed to open output for writing.");
      }
    }
    while( true ) {
      iVar2 = obudec_read_temporal_unit
                        ((ObuDecInputContext *)CONCAT44(uVar5,in_stack_fffffffffffffe08),
                         (uint8_t **)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      if (iVar2 != 0) {
        printf("Processed %d frames.\n",(ulong)local_14);
        aVar1 = aom_codec_destroy((aom_codec_ctx_t *)in_stack_fffffffffffffd68);
        if (aVar1 == AOM_CODEC_OK) {
          for (local_22c = 0; local_22c < in_stack_fffffffffffffe04; local_22c = local_22c + 1) {
            fclose(local_48[local_22c]);
          }
          fclose(__stream);
          return 0;
        }
        die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
      }
      in_stack_fffffffffffffd80 = (aom_codec_iface_t *)0x0;
      iter_00 = (aom_image_t *)0x0;
      aVar1 = aom_codec_decode((aom_codec_ctx_t *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                               (uint8_t *)file,0,(void *)0x0);
      if (aVar1 != AOM_CODEC_OK) break;
      while (iter_00 = aom_codec_get_frame((aom_codec_ctx_t *)in_stack_fffffffffffffd80,
                                           (aom_codec_iter_t *)iter_00),
            iter_00 != (aom_image_t *)0x0) {
        dst = aom_img_alloc(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                            in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                            in_stack_fffffffffffffd90);
        dst->bit_depth = 8;
        aom_img_downshift(dst,in_stack_fffffffffffffd68,0);
        if (iter_00->spatial_id == 0) {
          printf("Writing        base layer 0 %d\n",(ulong)local_14);
          aom_img_write((aom_image_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                        ,file);
        }
        else {
          if ((int)(in_stack_fffffffffffffe04 - 1) < iter_00->spatial_id) {
            die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)iter_00);
          }
          printf("Writing enhancement layer %d %d\n",(ulong)(uint)iter_00->spatial_id,
                 (ulong)local_14);
          aom_img_write((aom_image_t *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                        ,file);
        }
        if (iter_00->spatial_id == in_stack_fffffffffffffe04 - 1) {
          local_14 = local_14 + 1;
        }
      }
      in_stack_fffffffffffffd78 = (uint8_t *)0x0;
    }
    die_codec((aom_codec_ctx_t *)in_stack_fffffffffffffd80,(char *)iter_00);
  }
  die("Failed top open output for writing.");
}

Assistant:

int main(int argc, char **argv) {
  int frame_cnt = 0;
  FILE *outfile[MAX_LAYERS];
  char filename[80];
  FILE *inputfile = NULL;
  uint8_t *buf = NULL;
  size_t bytes_in_buffer = 0;
  size_t buffer_size = 0;
  struct AvxInputContext aom_input_ctx;
  struct ObuDecInputContext obu_ctx = { &aom_input_ctx, NULL, 0, 0, 0 };
  aom_codec_stream_info_t si;
  uint8_t tmpbuf[32];
  unsigned int i;

  exec_name = argv[0];

  if (argc != 2) die("Invalid number of arguments.");

  if (!(inputfile = fopen(argv[1], "rb")))
    die("Failed to open %s for read.", argv[1]);
  obu_ctx.avx_ctx->file = inputfile;
  obu_ctx.avx_ctx->filename = argv[1];

  aom_codec_iface_t *decoder = get_aom_decoder_by_index(0);
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (aom_codec_control(&codec, AV1D_SET_OUTPUT_ALL_LAYERS, 1)) {
    die_codec(&codec, "Failed to set output_all_layers control.");
  }

  // peak sequence header OBU to get number of spatial layers
  const size_t ret = fread(tmpbuf, 1, 32, inputfile);
  if (ret != 32) die_codec(&codec, "Input is not a valid obu file");
  si.is_annexb = 0;
  if (aom_codec_peek_stream_info(decoder, tmpbuf, 32, &si)) {
    die_codec(&codec, "Input is not a valid obu file");
  }
  fseek(inputfile, -32, SEEK_CUR);

  if (!file_is_obu(&obu_ctx))
    die_codec(&codec, "Input is not a valid obu file");

  // open base layer output yuv file
  snprintf(filename, sizeof(filename), "out_lyr%d.yuv", 0);
  if (!(outfile[0] = fopen(filename, "wb")))
    die("Failed top open output for writing.");

  // open any enhancement layer output yuv files
  for (i = 1; i < si.number_spatial_layers; i++) {
    snprintf(filename, sizeof(filename), "out_lyr%u.yuv", i);
    if (!(outfile[i] = fopen(filename, "wb")))
      die("Failed to open output for writing.");
  }

  while (!obudec_read_temporal_unit(&obu_ctx, &buf, &bytes_in_buffer,
                                    &buffer_size)) {
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    if (aom_codec_decode(&codec, buf, bytes_in_buffer, NULL))
      die_codec(&codec, "Failed to decode frame.");

    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      aom_image_t *img_shifted =
          aom_img_alloc(NULL, AOM_IMG_FMT_I420, img->d_w, img->d_h, 16);
      img_shifted->bit_depth = 8;
      aom_img_downshift(img_shifted, img,
                        img->bit_depth - img_shifted->bit_depth);
      if (img->spatial_id == 0) {
        printf("Writing        base layer 0 %d\n", frame_cnt);
        aom_img_write(img_shifted, outfile[0]);
      } else if (img->spatial_id <= (int)(si.number_spatial_layers - 1)) {
        printf("Writing enhancement layer %d %d\n", img->spatial_id, frame_cnt);
        aom_img_write(img_shifted, outfile[img->spatial_id]);
      } else {
        die_codec(&codec, "Invalid bitstream. Layer id exceeds layer count");
      }
      if (img->spatial_id == (int)(si.number_spatial_layers - 1)) ++frame_cnt;
    }
  }

  printf("Processed %d frames.\n", frame_cnt);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");

  for (i = 0; i < si.number_spatial_layers; i++) fclose(outfile[i]);

  fclose(inputfile);

  return EXIT_SUCCESS;
}